

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O2

void __thiscall
antlr::NoViableAltException::NoViableAltException
          (NoViableAltException *this,RefToken *t,string *fileName_)

{
  TokenRef *pTVar1;
  int line_;
  int column_;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"NoViableAlt",&local_41);
  line_ = (*t->ref->ptr->_vptr_Token[3])();
  column_ = (*t->ref->ptr->_vptr_Token[2])();
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_40,fileName_,line_,column_);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__NoViableAltException_002c1f10;
  pTVar1 = t->ref;
  if (pTVar1 != (TokenRef *)0x0) {
    pTVar1->count = pTVar1->count + 1;
  }
  (this->token).ref = pTVar1;
  ASTRefCount<antlr::AST>::ASTRefCount(&this->node,(AST *)0x0);
  return;
}

Assistant:

NoViableAltException::NoViableAltException(
	RefToken t,
	const ANTLR_USE_NAMESPACE(std)string& fileName_
) : RecognitionException("NoViableAlt",fileName_,t->getLine(),t->getColumn()),
    token(t), node(nullASTptr)
{
}